

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

uint __thiscall llvm::dwarf::getLanguage(dwarf *this,StringRef LanguageString)

{
  uint uVar1;
  StringSwitch<unsigned_int,_unsigned_int> *pSVar2;
  StringLiteral S;
  StringLiteral S_00;
  StringLiteral S_01;
  StringLiteral S_02;
  StringLiteral S_03;
  StringLiteral S_04;
  StringLiteral S_05;
  StringLiteral S_06;
  StringLiteral S_07;
  StringLiteral S_08;
  StringLiteral S_09;
  StringLiteral S_10;
  StringLiteral S_11;
  StringLiteral S_12;
  StringLiteral S_13;
  StringLiteral S_14;
  StringLiteral S_15;
  StringLiteral S_16;
  StringLiteral S_17;
  StringLiteral S_18;
  StringLiteral S_19;
  StringLiteral S_20;
  StringLiteral S_21;
  StringLiteral S_22;
  StringLiteral S_23;
  StringLiteral S_24;
  StringLiteral S_25;
  StringLiteral S_26;
  StringLiteral S_27;
  StringLiteral S_28;
  StringLiteral S_29;
  StringLiteral S_30;
  StringLiteral S_31;
  StringLiteral S_32;
  StringLiteral S_33;
  StringLiteral S_34;
  StringLiteral S_35;
  StringLiteral S_36;
  StringLiteral S_37;
  StringLiteral S_38;
  StringSwitch<unsigned_int,_unsigned_int> local_48;
  
  local_48.Str.Length = (size_t)LanguageString.Data;
  local_48.Result.Storage.field_0.empty = '\0';
  local_48.Result.Storage.hasVal = false;
  S.super_StringRef.Length = 0xb;
  S.super_StringRef.Data = "DW_LANG_C89";
  local_48.Str.Data = (char *)this;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(&local_48,S,1);
  S_00.super_StringRef.Length = 9;
  S_00.super_StringRef.Data = "DW_LANG_C";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_00,2);
  S_01.super_StringRef.Length = 0xd;
  S_01.super_StringRef.Data = "DW_LANG_Ada83";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_01,3);
  S_02.super_StringRef.Length = 0x13;
  S_02.super_StringRef.Data = "DW_LANG_C_plus_plus";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_02,4);
  S_03.super_StringRef.Length = 0xf;
  S_03.super_StringRef.Data = "DW_LANG_Cobol74";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_03,5);
  S_04.super_StringRef.Length = 0xf;
  S_04.super_StringRef.Data = "DW_LANG_Cobol85";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_04,6);
  S_05.super_StringRef.Length = 0x11;
  S_05.super_StringRef.Data = "DW_LANG_Fortran77";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_05,7);
  S_06.super_StringRef.Length = 0x11;
  S_06.super_StringRef.Data = "DW_LANG_Fortran90";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_06,8);
  S_07.super_StringRef.Length = 0x10;
  S_07.super_StringRef.Data = "DW_LANG_Pascal83";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_07,9);
  S_08.super_StringRef.Length = 0xf;
  S_08.super_StringRef.Data = "DW_LANG_Modula2";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_08,10);
  S_09.super_StringRef.Length = 0xc;
  S_09.super_StringRef.Data = "DW_LANG_Java";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_09,0xb);
  S_10.super_StringRef.Length = 0xb;
  S_10.super_StringRef.Data = "DW_LANG_C99";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_10,0xc);
  S_11.super_StringRef.Length = 0xd;
  S_11.super_StringRef.Data = "DW_LANG_Ada95";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_11,0xd);
  S_12.super_StringRef.Length = 0x11;
  S_12.super_StringRef.Data = "DW_LANG_Fortran95";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_12,0xe);
  S_13.super_StringRef.Length = 0xb;
  S_13.super_StringRef.Data = "DW_LANG_PLI";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_13,0xf);
  S_14.super_StringRef.Length = 0xc;
  S_14.super_StringRef.Data = "DW_LANG_ObjC";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_14,0x10);
  S_15.super_StringRef.Length = 0x16;
  S_15.super_StringRef.Data = "DW_LANG_ObjC_plus_plus";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_15,0x11);
  S_16.super_StringRef.Length = 0xb;
  S_16.super_StringRef.Data = "DW_LANG_UPC";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_16,0x12);
  S_17.super_StringRef.Length = 9;
  S_17.super_StringRef.Data = "DW_LANG_D";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_17,0x13);
  S_18.super_StringRef.Length = 0xe;
  S_18.super_StringRef.Data = "DW_LANG_Python";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_18,0x14);
  S_19.super_StringRef.Length = 0xe;
  S_19.super_StringRef.Data = "DW_LANG_OpenCL";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_19,0x15);
  S_20.super_StringRef.Length = 10;
  S_20.super_StringRef.Data = "DW_LANG_Go";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_20,0x16);
  S_21.super_StringRef.Length = 0xf;
  S_21.super_StringRef.Data = "DW_LANG_Modula3";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_21,0x17);
  S_22.super_StringRef.Length = 0xf;
  S_22.super_StringRef.Data = "DW_LANG_Haskell";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_22,0x18);
  S_23.super_StringRef.Length = 0x16;
  S_23.super_StringRef.Data = "DW_LANG_C_plus_plus_03";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_23,0x19);
  S_24.super_StringRef.Length = 0x16;
  S_24.super_StringRef.Data = "DW_LANG_C_plus_plus_11";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_24,0x1a);
  S_25.super_StringRef.Length = 0xd;
  S_25.super_StringRef.Data = "DW_LANG_OCaml";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_25,0x1b);
  S_26.super_StringRef.Length = 0xc;
  S_26.super_StringRef.Data = "DW_LANG_Rust";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_26,0x1c);
  S_27.super_StringRef.Length = 0xb;
  S_27.super_StringRef.Data = "DW_LANG_C11";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_27,0x1d);
  S_28.super_StringRef.Length = 0xd;
  S_28.super_StringRef.Data = "DW_LANG_Swift";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_28,0x1e);
  S_29.super_StringRef.Length = 0xd;
  S_29.super_StringRef.Data = "DW_LANG_Julia";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_29,0x1f);
  S_30.super_StringRef.Length = 0xd;
  S_30.super_StringRef.Data = "DW_LANG_Dylan";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_30,0x20);
  S_31.super_StringRef.Length = 0x16;
  S_31.super_StringRef.Data = "DW_LANG_C_plus_plus_14";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_31,0x21);
  S_32.super_StringRef.Length = 0x11;
  S_32.super_StringRef.Data = "DW_LANG_Fortran03";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_32,0x22);
  S_33.super_StringRef.Length = 0x11;
  S_33.super_StringRef.Data = "DW_LANG_Fortran08";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_33,0x23);
  S_34.super_StringRef.Length = 0x14;
  S_34.super_StringRef.Data = "DW_LANG_RenderScript";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_34,0x24);
  S_35.super_StringRef.Length = 0xd;
  S_35.super_StringRef.Data = "DW_LANG_BLISS";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_35,0x25);
  S_36.super_StringRef.Length = 0x16;
  S_36.super_StringRef.Data = "DW_LANG_Mips_Assembler";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_36,0x8001);
  S_37.super_StringRef.Length = 0x1b;
  S_37.super_StringRef.Data = "DW_LANG_GOOGLE_RenderScript";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_37,0x8e57);
  S_38.super_StringRef.Length = 0x16;
  S_38.super_StringRef.Data = "DW_LANG_BORLAND_Delphi";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_38,0xb000);
  uVar1 = StringSwitch<unsigned_int,_unsigned_int>::Default(pSVar2,0);
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::getLanguage(StringRef LanguageString) {
  return StringSwitch<unsigned>(LanguageString)
#define HANDLE_DW_LANG(ID, NAME, LOWER_BOUND, VERSION, VENDOR)                 \
  .Case("DW_LANG_" #NAME, DW_LANG_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(0);
}